

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O3

void DeleteObservation(pyhanabi_observation_t *observation)

{
  void *pvVar1;
  
  if (observation == (pyhanabi_observation_t *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x284,"void DeleteObservation(pyhanabi_observation_t *)");
  }
  pvVar1 = observation->observation;
  if (pvVar1 != (void *)0x0) {
    if (*(void **)((long)pvVar1 + 0x78) != (void *)0x0) {
      operator_delete(*(void **)((long)pvVar1 + 0x78));
    }
    if (*(void **)((long)pvVar1 + 0x58) != (void *)0x0) {
      operator_delete(*(void **)((long)pvVar1 + 0x58));
    }
    if (*(void **)((long)pvVar1 + 0x38) != (void *)0x0) {
      operator_delete(*(void **)((long)pvVar1 + 0x38));
    }
    if (*(void **)((long)pvVar1 + 0x20) != (void *)0x0) {
      operator_delete(*(void **)((long)pvVar1 + 0x20));
    }
    std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
    ~vector((vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             *)((long)pvVar1 + 8));
    operator_delete(pvVar1);
    observation->observation = (void *)0x0;
    return;
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x285,"void DeleteObservation(pyhanabi_observation_t *)");
}

Assistant:

void DeleteObservation(pyhanabi_observation_t* observation) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  delete reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
      observation->observation);
  observation->observation = nullptr;
}